

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O2

int __thiscall
merlin::graphical_model::order_score(graphical_model *this,graph *g,size_t v,OrderMethod kOType)

{
  _Rb_tree_header *p_Var1;
  double dVar2;
  pointer pmVar3;
  index j_00;
  pointer peVar4;
  _Rb_tree_node_base *p_Var5;
  edge_id *peVar6;
  _Base_ptr p_Var7;
  size_t sVar8;
  runtime_error *this_00;
  long lVar9;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_01;
  int iVar10;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> S;
  variable local_70;
  size_t j;
  _Rb_tree_node_base local_58;
  size_t local_38;
  
  switch(kOType.t_) {
  case MinFill:
    pmVar3 = (g->m_adj).
             super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    p_Var1 = &S._M_t._M_impl.super__Rb_tree_header;
    S._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         S._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    S._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    S._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    peVar4 = *(pointer *)
              &pmVar3[v].super_my_vector<merlin::edge_id>.
               super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>;
    S._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    S._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    for (; peVar4 != *(pointer *)
                      ((long)&pmVar3[v].super_my_vector<merlin::edge_id>.
                              super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_> + 8);
        peVar4 = peVar4 + 1) {
      j = peVar4->second;
      if (peVar4->first != j && peVar4->first == v) {
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_unique<unsigned_long_const&>
                  ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                    *)&S,&j);
      }
    }
    iVar10 = 0;
    for (p_Var7 = S._M_t._M_impl.super__Rb_tree_header._M_header._M_left; p_Var5 = p_Var7,
        (_Rb_tree_header *)p_Var7 != p_Var1; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      while (p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5),
            (_Rb_tree_header *)p_Var5 != p_Var1) {
        peVar6 = graph::edge(g,*(index *)(p_Var7 + 1),*(index *)(p_Var5 + 1));
        iVar10 = iVar10 + (uint)(peVar6->second == DAT_001994c8 && edge_id::NO_EDGE == peVar6->first
                                );
      }
    }
    this_01 = &S._M_t;
    break;
  case WtMinFill:
    pmVar3 = (g->m_adj).
             super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_58._M_color = _S_red;
    local_58._M_parent = (_Base_ptr)0x0;
    local_38 = 0;
    local_58._M_left = &local_58;
    local_58._M_right = &local_58;
    for (peVar4 = *(pointer *)
                   &pmVar3[v].super_my_vector<merlin::edge_id>.
                    super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>;
        peVar4 != *(pointer *)
                   ((long)&pmVar3[v].super_my_vector<merlin::edge_id>.
                           super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_> + 8);
        peVar4 = peVar4 + 1) {
      S._M_t._M_impl._0_8_ = peVar4->second;
      if (peVar4->first != S._M_t._M_impl._0_8_ && peVar4->first == v) {
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_unique<unsigned_long_const&>
                  ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                    *)&j,(unsigned_long *)&S);
      }
    }
    S._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    S._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    S._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    S._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    S._M_t._M_impl._0_8_ = 0;
    S._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    S._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    for (p_Var7 = local_58._M_left; p_Var5 = p_Var7, p_Var7 != &local_58;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      while (p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5), p_Var5 != &local_58) {
        j_00 = *(index *)(p_Var5 + 1);
        peVar6 = graph::edge(g,*(index *)(p_Var7 + 1),j_00);
        if ((edge_id::NO_EDGE == peVar6->first) && (DAT_001994c8 == peVar6->second)) {
          dVar2 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[j_00];
          local_70.m_states = (size_t)dVar2;
          local_70.m_states =
               (long)(dVar2 - 9.223372036854776e+18) & (long)local_70.m_states >> 0x3f |
               local_70.m_states;
          local_70.m_label = j_00;
          variable_set::operator|=((variable_set *)&S,&local_70);
        }
      }
    }
    sVar8 = variable_set::num_states((variable_set *)&S);
    iVar10 = (int)sVar8;
    variable_set::~variable_set((variable_set *)&S);
    this_01 = (_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               *)&j;
    break;
  case MinWidth:
    pmVar3 = (g->m_adj).
             super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar10 = 0;
    for (peVar4 = *(pointer *)
                   &pmVar3[v].super_my_vector<merlin::edge_id>.
                    super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>;
        peVar4 != *(pointer *)
                   ((long)&pmVar3[v].super_my_vector<merlin::edge_id>.
                           super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_> + 8);
        peVar4 = peVar4 + 1) {
      if (peVar4->first == v) {
        iVar10 = iVar10 + (uint)(peVar4->second != v);
      }
    }
    return iVar10;
  case WtMinWidth:
    pmVar3 = (g->m_adj).
             super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar10 = 0;
    for (peVar4 = *(pointer *)
                   &pmVar3[v].super_my_vector<merlin::edge_id>.
                    super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>;
        peVar4 != *(pointer *)
                   ((long)&pmVar3[v].super_my_vector<merlin::edge_id>.
                           super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_> + 8);
        peVar4 = peVar4 + 1) {
      if (peVar4->first != peVar4->second && peVar4->first == v) {
        dVar2 = (this->m_dims).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[peVar4->second];
        lVar9 = (long)dVar2;
        iVar10 = iVar10 + ((uint)lVar9 |
                          (uint)(long)(dVar2 - 9.223372036854776e+18) & (uint)(lVar9 >> 0x3f));
      }
    }
    return iVar10;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unknown elimination ordering type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(this_01);
  return iVar10;
}

Assistant:

int order_score(const graph& g, size_t v, OrderMethod kOType) const {
		int s = 0.0;
		switch (kOType) {
		case OrderMethod::MinFill:
			{
				const my_set<edge_id>& nlist = g.neighbors(v);
				std::set<size_t> S;
				for (my_set<edge_id>::const_iterator ci = nlist.begin(); ci != nlist.end(); ++ci) {
					size_t i = ci->first, j = ci->second;
					if (i == v && i != j)
						S.insert(j);
				}
				std::set<size_t>::iterator it1, it2;
				for (it1 = S.begin(); it1 != S.end(); ++it1) {
					it2 = it1;
					while (++it2 != S.end()) {
						size_t i = *it1, j = *it2;
						if (g.edge(i, j) == edge_id::NO_EDGE)
							++s;
					}
				}
				break;
			}
		case OrderMethod::WtMinFill:
			{
				const my_set<edge_id>& nlist = g.neighbors(v);
				std::set<size_t> S;
				for (my_set<edge_id>::const_iterator ci = nlist.begin(); ci != nlist.end(); ++ci) {
					size_t i = ci->first, j = ci->second;
					if (i == v && i != j)
						S.insert(j);
				}
				variable_set vs;
				std::set<size_t>::iterator it1, it2;
				for (it1 = S.begin(); it1 != S.end(); ++it1) {
					it2 = it1;
					while (++it2 != S.end()) {
						size_t i = *it1, j = *it2;
						if (g.edge(i, j) == edge_id::NO_EDGE)
							vs |= var(j);
					}
				}
				s = vs.num_states();
				break;
			}
		case OrderMethod::MinWidth:
			{
				const my_set<edge_id>& nlist = g.neighbors(v);
				for (my_set<edge_id>::const_iterator ci = nlist.begin(); ci != nlist.end(); ++ci) {
					size_t i = ci->first, j = ci->second;
					if (i == v && i != j)
						++s;
				}
				break;
			}
		case OrderMethod::WtMinWidth:
			{
				const my_set<edge_id>& nlist = g.neighbors(v);
				for (my_set<edge_id>::const_iterator ci = nlist.begin(); ci != nlist.end(); ++ci) {
					size_t i = ci->first, j = ci->second;
					if (i == v && i != j)
						s += var(j).states();
				}
				break;
			}
		default:
			throw std::runtime_error("Unknown elimination ordering type");
			break;
		}
		return s;
	}